

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.cpp
# Opt level: O3

bool __thiscall CEObservation::NeedsUpdate(CEObservation *this)

{
  bool bVar1;
  double dVar2;
  
  if (this->date_ == (CEDate *)0x0) {
    bVar1 = false;
  }
  else {
    dVar2 = CEDate::operator_cast_to_double(this->date_);
    bVar1 = (bool)(-(dVar2 != this->cached_date_) & 1);
  }
  return bVar1;
}

Assistant:

bool CEObservation::NeedsUpdate(void)
{
    // Make sure the date object isnt nullptr
    if (date_ == nullptr) {
        return false ;
    }
    // Check if the date object has changed since the last time we querried it
    else if ((*date_) != cached_date_) {
        return true ;
    }
    // Otherwise we want to return false
    else {
        return false ;
    }
}